

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemoNoTemplates.cpp
# Opt level: O3

void demo2(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Param param;
  IMLE imleObj;
  string local_4c8;
  Param local_4a8;
  IMLE local_400;
  
  IMLE::Param::Param(&local_4a8,1,1);
  lVar3 = 1;
  if (local_4a8.Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != 1) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&local_4a8.Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,1,1);
    lVar3 = local_4a8.Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    if (local_4a8.Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows < 1) goto LAB_0013fe8f;
  }
  auVar2 = _DAT_0018a020;
  auVar1 = _DAT_0018a010;
  uVar4 = lVar3 + 0x1fffffffffffffffU & 0x1fffffffffffffff;
  auVar6._8_4_ = (int)uVar4;
  auVar6._0_8_ = uVar4;
  auVar6._12_4_ = (int)(uVar4 >> 0x20);
  lVar5 = 0;
  auVar6 = auVar6 ^ _DAT_0018a020;
  do {
    auVar7._8_4_ = (int)lVar5;
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar7 = (auVar7 | auVar1) ^ auVar2;
    if ((bool)(~(auVar7._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar7._0_4_ ||
                auVar6._4_4_ < auVar7._4_4_) & 1)) {
      local_4a8.Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [lVar5] = 0.1;
    }
    if ((auVar7._12_4_ != auVar6._12_4_ || auVar7._8_4_ <= auVar6._8_4_) &&
        auVar7._12_4_ <= auVar6._12_4_) {
      local_4a8.Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [lVar5 + 1] = 0.1;
    }
    lVar5 = lVar5 + 2;
  } while ((uVar4 - ((uint)(lVar3 + 0x1fffffffffffffffU) & 1)) + 2 != lVar5);
LAB_0013fe8f:
  local_4a8.sigma0 = 1.0;
  local_4a8.p0 = 0.2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t --- Param constructor: ---",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  IMLE::IMLE(&local_400,1,1,&local_4a8,0x800);
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"cos1D.xml","");
  IMLE::createDefaultParamFile(1,1,&local_4c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p);
  }
  cos1D_testSaveLoadAndParamHandling<IMLE>(&local_400);
  IMLE::~IMLE(&local_400);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8.defaultSave._M_dataplus._M_p != &local_4a8.defaultSave.field_2) {
    operator_delete(local_4a8.defaultSave._M_dataplus._M_p);
  }
  free(local_4a8.Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  return;
}

Assistant:

void demo2()
{
    int d = 1;    //Input dimension
    int D = 1;    //Output dimension

    //      IMLE Parameters
    IMLE::Param param(d,D);
    param.Psi0 = IMLE::X::Constant(D,0.1);
    param.sigma0 = 1.0;
    param.p0 = 0.2;

    // Param constructor:
    cout << "\t --- Param constructor: ---" << endl;
    IMLE imleObj(d,D,param);

    // Default Param File:
    IMLE::createDefaultParamFile(d,D,"cos1D.xml");

    cos1D_testSaveLoadAndParamHandling(imleObj );
}